

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_basics<vector_malloc_counter_clear<unsigned_long,16u>>(void)

{
  uint __line;
  ostream *poVar1;
  unsigned_long uVar2;
  char *__assertion;
  size_t sVar3;
  uint i;
  unsigned_long local_40;
  vector_malloc_counter_clear<unsigned_long,_16U> v;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "void test_basics() [Container = vector_malloc_counter_clear<unsigned long>]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  v._capacity = 0;
  v._data = (unsigned_long *)0x0;
  v._size = 0;
  local_40 = 1;
  vector_malloc_counter_clear<unsigned_long,_16U>::push_back(&v,&local_40);
  if (v._size == 1) {
    uVar2 = vector_malloc_counter_clear<unsigned_long,_16U>::operator[](&v,0);
    if (uVar2 == 1) {
      free(v._data);
      v._capacity = 0;
      v._data = (unsigned_long *)0x0;
      v._size = 0;
      sVar3 = 0xffffffffffffffff;
      while (sVar3 != 999999) {
        sVar3 = sVar3 + 1;
        if (sVar3 != v._size) {
          __assertion = "v.size()==i";
          __line = 0x2b;
          goto LAB_00127b40;
        }
        local_40 = sVar3;
        vector_malloc_counter_clear<unsigned_long,_16U>::push_back(&v,&local_40);
        uVar2 = vector_malloc_counter_clear<unsigned_long,_16U>::operator[](&v,sVar3);
        if (sVar3 != (uVar2 & 0xffffffff)) goto code_r0x00127986;
      }
      if (v._size != 1000000) {
        __assertion = "v.size()==N";
        __line = 0x2f;
        goto LAB_00127b40;
      }
      free(v._data);
      v._capacity = 0;
      v._data = (unsigned_long *)0x0;
      v._size = 0;
      for (sVar3 = 0; sVar3 != 1000000; sVar3 = sVar3 + 1) {
        local_40 = sVar3;
        vector_malloc_counter_clear<unsigned_long,_16U>::push_back(&v,&local_40);
      }
      sVar3 = 0xffffffffffffffff;
      while (sVar3 != 999999) {
        sVar3 = sVar3 + 1;
        uVar2 = vector_malloc_counter_clear<unsigned_long,_16U>::operator[](&v,sVar3);
        if (sVar3 != (uVar2 & 0xffffffff)) {
          __assertion = "unsigned(v[i])==i";
          __line = 0x35;
          goto LAB_00127b40;
        }
      }
      v._size = 0;
      for (sVar3 = 0; sVar3 != 1000000; sVar3 = sVar3 + 1) {
        local_40 = sVar3;
        vector_malloc_counter_clear<unsigned_long,_16U>::push_back(&v,&local_40);
      }
      sVar3 = 0xffffffffffffffff;
      do {
        if (sVar3 == 999999) {
          v._size = 0;
          for (sVar3 = 0; sVar3 != 1000000; sVar3 = sVar3 + 1) {
            local_40 = sVar3;
            vector_malloc_counter_clear<unsigned_long,_16U>::push_back(&v,&local_40);
          }
          sVar3 = 0xffffffffffffffff;
          do {
            if (sVar3 == 999999) {
              v._size = 0;
              free(v._data);
              return;
            }
            sVar3 = sVar3 + 1;
            uVar2 = vector_malloc_counter_clear<unsigned_long,_16U>::operator[](&v,sVar3);
          } while (sVar3 == (uVar2 & 0xffffffff));
          __assertion = "unsigned(v[i])==i";
          __line = 0x3d;
          goto LAB_00127b40;
        }
        sVar3 = sVar3 + 1;
        uVar2 = vector_malloc_counter_clear<unsigned_long,_16U>::operator[](&v,sVar3);
      } while (sVar3 == (uVar2 & 0xffffffff));
      __assertion = "unsigned(v[i])==i";
      __line = 0x39;
    }
    else {
      __assertion = "v[0]==1";
      __line = 0x25;
    }
  }
  else {
    __assertion = "v.size()==1";
    __line = 0x24;
  }
LAB_00127b40:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                ,__line,
                "void test_basics() [Container = vector_malloc_counter_clear<unsigned long>]");
code_r0x00127986:
  __assertion = "unsigned(v[i])==i";
  __line = 0x2d;
  goto LAB_00127b40;
}

Assistant:

void test_basics()
{
	std::cerr<<__PRETTY_FUNCTION__<<std::endl;
	{
		Container v;
		assert(v.size()==0);
	}
	{
		Container v;
		v.push_back(1);
		assert(v.size()==1);
		assert(v[0]==1);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) {
			assert(v.size()==i);
			v.push_back(i);
			assert(unsigned(v[i])==i);
		}
		assert(v.size()==N);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
	}
}